

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFormatTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::TextureCubeFormatCase::init(TextureCubeFormatCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *str;
  ostringstream *this_00;
  deUint32 dataType;
  TestLog *pTVar1;
  int iVar2;
  ostream *poVar3;
  MessageBuilder *pMVar4;
  TextureCube *this_01;
  int face;
  long lVar5;
  long lVar6;
  TextureFormatInfo spec;
  Vec4 gMin;
  ostringstream fmtName;
  TextureFormatInfo TStack_3a8;
  undefined1 local_360 [4];
  float fStack_35c;
  float local_358;
  float fStack_354;
  TextureFormat local_340;
  LogGradientFmt local_338;
  undefined1 local_328 [384];
  ostringstream local_1a8 [376];
  
  pTVar1 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  if (this->m_dataType == 0) {
    local_340 = glu::mapGLInternalFormat(this->m_format);
  }
  else {
    local_340 = glu::mapGLTransferFormat(this->m_format,this->m_dataType);
  }
  tcu::getTextureFormatInfo(&TStack_3a8,&local_340);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  if (this->m_dataType == 0) {
    local_328._0_8_ = glu::getTextureFormatName;
    local_328._8_4_ = this->m_format;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_328,(ostream *)local_1a8);
  }
  else {
    local_328._0_8_ = glu::getTextureFormatName;
    local_328._8_4_ = this->m_format;
    poVar3 = tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_328,(ostream *)local_1a8)
    ;
    poVar3 = std::operator<<(poVar3,", ");
    local_358 = (float)this->m_dataType;
    local_360 = (undefined1  [4])0x8b1f07;
    fStack_35c = 0.0;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_360,poVar3);
  }
  this_00 = (ostringstream *)(local_328 + 8);
  local_328._0_8_ = pTVar1;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"Cube map texture, ");
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)this_00,(string *)local_360);
  std::operator<<((ostream *)this_00,", ");
  pMVar4 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_328,&this->m_width);
  std::operator<<((ostream *)&pMVar4->m_str,"x");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&this->m_height);
  str = &pMVar4->m_str;
  std::operator<<((ostream *)str,",\n  fill with ");
  local_338.valueMax = (Vec4 *)((long)&TStack_3a8 + 0x10);
  local_338.valueMin = &TStack_3a8.valueMin;
  glu::TextureTestUtil::operator<<((ostream *)str,&local_338);
  std::operator<<((ostream *)str," gradient");
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)local_360);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  dataType = this->m_dataType;
  if (dataType == 0) {
    this_01 = (TextureCube *)operator_new(0x180);
    glu::TextureCube::TextureCube(this_01,this->m_renderCtx,this->m_format,this->m_width);
  }
  else {
    this_01 = (TextureCube *)operator_new(0x180);
    glu::TextureCube::TextureCube(this_01,this->m_renderCtx,this->m_format,dataType,this->m_width);
  }
  this->m_texture = this_01;
  lVar6 = 0;
  for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_328);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_360);
    local_328._0_4_ = TStack_3a8.valueMin.m_data[0];
    local_328._4_4_ = TStack_3a8.valueMin.m_data[1];
    local_328._8_4_ = TStack_3a8.valueMin.m_data[2];
    local_328._12_4_ = TStack_3a8.valueMin.m_data[3];
    local_360 = (undefined1  [4])TStack_3a8.valueMax.m_data[0];
    fStack_35c = TStack_3a8.valueMax.m_data[1];
    local_358 = TStack_3a8.valueMax.m_data[2];
    fStack_354 = TStack_3a8.valueMax.m_data[3];
    tcu::TextureCube::allocLevel(&this->m_texture->m_refTexture,(CubeFace)lVar5,0);
    tcu::fillWithComponentGradients
              (*(PixelBufferAccess **)
                ((long)&(this->m_texture->m_refTexture).m_access[0].
                        super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar6),
               (Vector<float,_4> *)local_328,(Vector<float,_4> *)local_360);
    lVar6 = lVar6 + 0x18;
  }
  glu::TextureCube::upload(this->m_texture);
  this->m_curFace = 0;
  this->m_isOk = true;
  iVar2 = std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return iVar2;
}

Assistant:

void TextureCubeFormatCase::init (void)
{
	TestLog&				log		= m_testCtx.getLog();
	tcu::TextureFormat		fmt		= m_dataType ? glu::mapGLTransferFormat(m_format, m_dataType) : glu::mapGLInternalFormat(m_format);
	tcu::TextureFormatInfo	spec	= tcu::getTextureFormatInfo(fmt);
	std::ostringstream		fmtName;

	if (m_dataType)
		fmtName << glu::getTextureFormatStr(m_format) << ", " << glu::getTypeStr(m_dataType);
	else
		fmtName << glu::getTextureFormatStr(m_format);

	log << TestLog::Message << "Cube map texture, " << fmtName.str() << ", " << m_width << "x" << m_height
							<< ",\n  fill with " << formatGradient(&spec.valueMin, &spec.valueMax) << " gradient"
		<< TestLog::EndMessage;

	DE_ASSERT(m_width == m_height);
	m_texture = m_dataType != GL_NONE
			  ? new glu::TextureCube(m_renderCtx, m_format, m_dataType, m_width)	// Implicit internal format.
		      : new glu::TextureCube(m_renderCtx, m_format, m_width);				// Explicit internal format.

	// Fill level 0.
	for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
	{
		tcu::Vec4 gMin, gMax;

		switch (face)
		{
			case 0: gMin = spec.valueMin.swizzle(0, 1, 2, 3); gMax = spec.valueMax.swizzle(0, 1, 2, 3); break;
			case 1: gMin = spec.valueMin.swizzle(2, 1, 0, 3); gMax = spec.valueMax.swizzle(2, 1, 0, 3); break;
			case 2: gMin = spec.valueMin.swizzle(1, 2, 0, 3); gMax = spec.valueMax.swizzle(1, 2, 0, 3); break;
			case 3: gMin = spec.valueMax.swizzle(0, 1, 2, 3); gMax = spec.valueMin.swizzle(0, 1, 2, 3); break;
			case 4: gMin = spec.valueMax.swizzle(2, 1, 0, 3); gMax = spec.valueMin.swizzle(2, 1, 0, 3); break;
			case 5: gMin = spec.valueMax.swizzle(1, 2, 0, 3); gMax = spec.valueMin.swizzle(1, 2, 0, 3); break;
			default:
				DE_ASSERT(false);
		}

		m_texture->getRefTexture().allocLevel((tcu::CubeFace)face, 0);
		tcu::fillWithComponentGradients(m_texture->getRefTexture().getLevelFace(0, (tcu::CubeFace)face), gMin, gMax);
	}

	// Upload texture data to GL.
	m_texture->upload();

	// Initialize iteration state.
	m_curFace	= 0;
	m_isOk		= true;
}